

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O3

void __thiscall xe::TestResultParser::TestResultParser(TestResultParser *this)

{
  xml::Parser::Parser(&this->m_xmlParser);
  this->m_result = (TestCaseResult *)0x0;
  this->m_state = STATE_NOT_INITIALIZED;
  this->m_logVersion = TESTLOGVERSION_LAST;
  (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_itemStack).super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_curItemList = (List *)0x0;
  this->m_base64DecodeOffset = 0;
  (this->m_curNumValue)._M_dataplus._M_p = (pointer)&(this->m_curNumValue).field_2;
  (this->m_curNumValue)._M_string_length = 0;
  (this->m_curNumValue).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

TestResultParser::TestResultParser (void)
	: m_result				(DE_NULL)
	, m_state				(STATE_NOT_INITIALIZED)
	, m_logVersion			(TESTLOGVERSION_LAST)
	, m_curItemList			(DE_NULL)
	, m_base64DecodeOffset	(0)
{
}